

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs_wrapper.hpp
# Opt level: O2

char * AvisynthPluginInit3(IScriptEnvironment *env,AVS_Linkage *linkage)

{
  undefined *puVar1;
  _func_void_IScriptEnvironment_ptr **RegisterFilter;
  pointer pp_Var2;
  vector<void_(*)(IScriptEnvironment_*),_std::allocator<void_(*)(IScriptEnvironment_*)>_> filters;
  _Vector_base<void_(*)(IScriptEnvironment_*),_std::allocator<void_(*)(IScriptEnvironment_*)>_>
  local_30;
  
  AVS_linkage = linkage;
  RegisterAVSFilters();
  for (pp_Var2 = local_30._M_impl.super__Vector_impl_data._M_start; puVar1 = Plugin::Description,
      pp_Var2 != local_30._M_impl.super__Vector_impl_data._M_finish; pp_Var2 = pp_Var2 + 1) {
    (**pp_Var2)(env);
  }
  std::_Vector_base<void_(*)(IScriptEnvironment_*),_std::allocator<void_(*)(IScriptEnvironment_*)>_>
  ::~_Vector_base(&local_30);
  return puVar1;
}

Assistant:

__declspec(dllexport) const char* __stdcall AvisynthPluginInit3(IScriptEnvironment* env, AVS_Linkage* linkage)
{
  AVS_linkage = linkage;
  auto filters = RegisterAVSFilters();
  for (auto &&RegisterFilter : filters) {
    RegisterFilter(env);
  }
  return Plugin::Description;
}